

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3IncrmergeHintPush(Blob *pHint,i64 iAbsLevel,int nInput,int *pRc)

{
  int iVar1;
  int *in_RCX;
  int in_EDX;
  Blob *in_RSI;
  long *in_RDI;
  
  blobGrowBuffer(in_RSI,in_EDX,in_RCX);
  if (*in_RCX == 0) {
    iVar1 = sqlite3Fts3PutVarint((char *)(*in_RDI + (long)(int)in_RDI[1]),(sqlite_int64)in_RSI);
    *(int *)(in_RDI + 1) = iVar1 + (int)in_RDI[1];
    iVar1 = sqlite3Fts3PutVarint((char *)(*in_RDI + (long)(int)in_RDI[1]),(long)in_EDX);
    *(int *)(in_RDI + 1) = iVar1 + (int)in_RDI[1];
  }
  return;
}

Assistant:

static void fts3IncrmergeHintPush(
  Blob *pHint,                    /* Hint blob to append to */
  i64 iAbsLevel,                  /* First varint to store in hint */
  int nInput,                     /* Second varint to store in hint */
  int *pRc                        /* IN/OUT: Error code */
){
  blobGrowBuffer(pHint, pHint->n + 2*FTS3_VARINT_MAX, pRc);
  if( *pRc==SQLITE_OK ){
    pHint->n += sqlite3Fts3PutVarint(&pHint->a[pHint->n], iAbsLevel);
    pHint->n += sqlite3Fts3PutVarint(&pHint->a[pHint->n], (i64)nInput);
  }
}